

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O3

_Bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry *r)

{
  _Bool _Var1;
  upb_MiniTableExtension *e;
  
  e = UPB_linkarr_internal_empty_upb_AllExts;
  while (((e->field_dont_copy_me__upb_internal_use_only).number_dont_copy_me__upb_internal_use_only
          == 0 || (_Var1 = upb_ExtensionRegistry_Add(r,e), _Var1))) {
    e = e + 1;
    if ((upb_MiniTableExtension *)
        ((long)&UPB_linkarr_internal_empty_upb_AllExts[0].sub_dont_copy_me__upb_internal_use_only +
        7) < e) {
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry* r) {
  const upb_MiniTableExtension* start = UPB_LINKARR_START(upb_AllExts);
  const upb_MiniTableExtension* stop = UPB_LINKARR_STOP(upb_AllExts);
  for (const upb_MiniTableExtension* p = start; p < stop; p++) {
    // Windows can introduce zero padding, so we have to skip zeroes.
    if (upb_MiniTableExtension_Number(p) != 0) {
      if (!upb_ExtensionRegistry_Add(r, p)) return false;
    }
  }
  return true;
}